

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall
dgrminer::PartialUnion::addLabeledNodeOccurrence
          (PartialUnion *this,size_t node_index,int label,int changetime,
          vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_> *labeled_nodes,
          bool set_of_graphs,int occurrence)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  __last;
  int iVar1;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  _Var2;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *p_Var3;
  labeled_node ln;
  int local_11c;
  size_t local_118;
  undefined1 local_110 [16];
  _Rb_tree_node_base local_100;
  size_t local_e0;
  __node_base_ptr *local_d8;
  size_type local_d0;
  __node_base local_c8;
  size_type sStack_c0;
  float local_b8;
  size_t local_b0;
  __node_base_ptr p_Stack_a8;
  labeled_node local_a0;
  
  iVar1 = occurrence;
  local_100._M_left = &local_100;
  local_100._M_color = _S_red;
  local_100._M_parent = (_Base_ptr)0x0;
  local_e0 = 0;
  local_d8 = &p_Stack_a8;
  local_d0 = 1;
  local_c8._M_nxt = (_Hash_node_base *)0x0;
  sStack_c0 = 0;
  local_b8 = 1.0;
  local_b0 = 0;
  p_Stack_a8 = (__node_base_ptr)0x0;
  _Var2._M_current =
       (labeled_nodes->
       super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (labeled_nodes->
       super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_118 = node_index;
  local_110._0_4_ = changetime;
  local_110._4_4_ = label;
  local_100._M_right = local_100._M_left;
  labeled_node::labeled_node(&local_a0,(labeled_node *)local_110);
  _Var2 = std::
          find_if<__gnu_cxx::__normal_iterator<dgrminer::labeled_node*,std::vector<dgrminer::labeled_node,std::allocator<dgrminer::labeled_node>>>,dgrminer::labeled_node>
                    (_Var2,__last,&local_a0);
  labeled_node::~labeled_node(&local_a0);
  if (_Var2._M_current ==
      (labeled_nodes->
      super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
              (local_110 + 8);
    if (this->new_measures == false) {
      if (set_of_graphs) {
        local_11c = (this->mappingSnapshotsToGraphs).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1];
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   this_01,&local_11c);
      }
      else {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(this_01,&occurrence);
      }
    }
    else {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_01,&occurrence);
      p_Var3 = &std::__detail::
                _Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_d8,&occurrence)->_M_t;
      local_11c = (int)local_118;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(p_Var3,&local_11c);
    }
    std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::push_back
              (labeled_nodes,(value_type *)local_110);
  }
  else {
    this_00 = &(_Var2._M_current)->occurrences;
    if (this->new_measures == false) {
      if (set_of_graphs) {
        local_11c = (this->mappingSnapshotsToGraphs).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1];
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&this_00->_M_t,&local_11c);
      }
      else {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   this_00,&occurrence);
      }
    }
    else {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00
                 ,&occurrence);
      p_Var3 = &std::__detail::
                _Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&(_Var2._M_current)->multiple_occurrences,&occurrence)->_M_t;
      local_11c = (int)local_118;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(p_Var3,&local_11c);
    }
  }
  labeled_node::~labeled_node((labeled_node *)local_110);
  return;
}

Assistant:

void PartialUnion::addLabeledNodeOccurrence(
		size_t node_index,
		int label,
		int changetime,
		std::vector<labeled_node> & labeled_nodes,
		bool set_of_graphs,
		int occurrence
	) {
		labeled_node ln;
		ln.label = label; // nodes[i][PN_LABEL];
		ln.changetime = changetime; // nodes[i][PN_CHANGETIME];
		auto it = std::find_if(labeled_nodes.begin(), labeled_nodes.end(), ln);
		if (it != std::end(labeled_nodes))
		{
		  	if (new_measures) {
			  	it->occurrences.insert(occurrence);
				it->multiple_occurrences[occurrence].insert(node_index);
		  	}
		  	else  {
			  	if (set_of_graphs) {
					it->occurrences.insert(queryMappingSnapshotsToGraphs(occurrence));
				} else {
					it->occurrences.insert(occurrence);
				}
		  	}

		}
		else
		{
		  	if (new_measures) {
			  	ln.occurrences.insert(occurrence);
				ln.multiple_occurrences[occurrence].insert(node_index);
			} else {
			  	if (set_of_graphs) {
					ln.occurrences.insert(queryMappingSnapshotsToGraphs(occurrence));
				} else {
					ln.occurrences.insert(occurrence);
				}
		  	}

			labeled_nodes.push_back(ln);
		}
	}